

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O3

bool __thiscall
sf::priv::ImageLoader::loadImageFromStream
          (ImageLoader *this,InputStream *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  char *__s;
  stbi_uc *__src;
  ostream *poVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  stbi_io_callbacks callbacks;
  uint local_44;
  uint local_40 [2];
  stbi_io_callbacks local_38;
  
  puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (**(code **)(*(long *)stream + 0x18))(stream,0);
  local_38.read = anon_unknown.dwarf_242ed6::read;
  local_38.skip = anon_unknown.dwarf_242ed6::skip;
  local_38.eof = anon_unknown.dwarf_242ed6::eof;
  local_40[0] = 0;
  local_44 = 0;
  local_40[1] = 0;
  __src = stbi_load_from_callbacks
                    (&local_38,stream,(int *)local_40,(int *)&local_44,(int *)(local_40 + 1),4);
  if (__src == (stbi_uc *)0x0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to load image from stream. Reason: ",0x2a);
    __s = *(char **)(in_FS_OFFSET + -0x20);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    size->x = local_40[0];
    size->y = local_44;
    if (local_44 != 0 && local_40[0] != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pixels,(long)(int)(local_40[0] * local_44 * 4));
      puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar1,__src,
             (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    }
    free(__src);
  }
  return __src != (stbi_uc *)0x0;
}

Assistant:

bool ImageLoader::loadImageFromStream(InputStream& stream, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Setup the stb_image callbacks
    stbi_io_callbacks callbacks;
    callbacks.read = &read;
    callbacks.skip = &skip;
    callbacks.eof  = &eof;

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load_from_callbacks(&callbacks, &stream, &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = static_cast<unsigned int>(width);
        size.y = static_cast<unsigned int>(height);

        if (width && height)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(static_cast<std::size_t>(width * height * 4));
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image from stream. Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}